

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O1

int SetRoverCfgublox(UBLOX *publox)

{
  int iVar1;
  uchar CK_B;
  ssize_t sVar2;
  int i;
  long lVar3;
  uchar CK_A;
  uint uVar4;
  ulong uVar5;
  uchar sendbuf [512];
  char local_298 [27];
  char local_27d;
  undefined8 local_218;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 local_204;
  undefined2 local_200;
  char local_1fe;
  char local_1fd;
  
  local_27d = '\0';
  local_298[0xe] = '\0';
  local_298[0xf] = '\0';
  local_298[0x10] = 0;
  local_298[10] = '\0';
  local_298[0xb] = '\0';
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[0] = -0x4b;
  local_298[1] = 'b';
  local_298[2] = '\x06';
  local_298[3] = '\x17';
  local_298[4] = '\x14';
  local_298[5] = '\0';
  local_298[6] = '\0';
  local_298[7] = '#';
  local_298[8] = '\0';
  local_298[9] = '\n';
  local_298[0x11] = 1;
  local_298[0x12] = '\0';
  local_298[0x13] = '\0';
  local_298[0x14] = '\0';
  local_298[0x15] = '\0';
  local_298[0x16] = '\0';
  local_298[0x17] = '\0';
  local_298[0x18] = '\0';
  local_298[0x19] = '\0';
  lVar3 = 2;
  local_298[0x1a] = '\0';
  do {
    local_298[0x1a] = local_298[0x1a] + local_298[lVar3];
    local_27d = local_27d + local_298[0x1a];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1a);
  uStack_210 = 0xa00;
  local_218 = 0x23000014170662b5;
  uStack_20c = 0;
  uStack_208 = 0x100;
  local_204 = 0;
  local_200 = 0;
  iVar1 = (publox->RS232Port).DevType;
  local_1fe = local_298[0x1a];
  local_1fd = local_27d;
  if (iVar1 - 1U < 4) {
    iVar1 = (publox->RS232Port).s;
    uVar5 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_218 + uVar5),(long)(0x1c - (int)uVar5),0);
      if ((int)sVar2 < 1) goto LAB_0015496f;
      uVar4 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < 0x1c);
  }
  else {
    if (iVar1 != 0) {
LAB_0015496f:
      puts("Error writing data to a ublox. ");
      return 1;
    }
    iVar1 = *(int *)&(publox->RS232Port).hDev;
    uVar5 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_218 + uVar5),(ulong)(0x1c - (int)uVar5));
      if ((int)sVar2 < 1) goto LAB_0015496f;
      uVar4 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar4;
    } while (uVar4 < 0x1c);
  }
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(&local_218,0x1c,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int SetRoverCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	//unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;

	//// Enable GGA, RMC NMEA messages.
	//memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	//cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	//cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	//cfg_msg_pl[3] = 4; // UART1 rate.
	//cfg_msg_pl[5] = 4; // USB rate.
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Input Protocol and UBX+NMEA(+RTCM3) as Output Protocol...
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}